

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSharedLibrary.cpp
# Opt level: O0

void * __thiscall
MinVR::VRSharedLibrary::loadSymbolInternal(VRSharedLibrary *this,string *functionName)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long in_RDI;
  char *dlsym_error;
  void *symbol;
  void *local_8;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_8 = (void *)0x0;
  }
  else {
    uVar1 = *(undefined8 *)(in_RDI + 0x30);
    uVar2 = std::__cxx11::string::c_str();
    local_8 = (void *)dlsym(uVar1,uVar2);
    lVar3 = dlerror();
    if (lVar3 != 0) {
      dlerror();
      local_8 = (void *)0x0;
    }
  }
  return local_8;
}

Assistant:

void* VRSharedLibrary::loadSymbolInternal(const std::string &functionName) {
	if (_isLoaded)
	{
#if defined(WIN32)
		FARPROC symbol =GetProcAddress(_lib, functionName.c_str());
		if (!symbol) {
			//MinVR::Logger::getInstance().assertMessage(false, "Cannot load symbol: " + functionName + " - " + "");

			return NULL;
		}

		return symbol;
#else
		void* symbol = (void*) dlsym(_lib, functionName.c_str());
		const char* dlsym_error = dlerror();
		if (dlsym_error) {
			//MinVR::Logger::getInstance().assertMessage(false, "Cannot load symbol: " + functionName + " - " + dlsym_error);
			dlerror();

			return NULL;
		}

		return symbol;
#endif

	}

	return NULL;
}